

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PushID(char *str_id_begin,char *str_id_end)

{
  ImGuiID local_2c;
  ImGuiWindow *pIStack_28;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiContext *g;
  char *str_id_end_local;
  char *str_id_begin_local;
  
  window = (ImGuiWindow *)GImGui;
  pIStack_28 = GImGui->CurrentWindow;
  g = (ImGuiContext *)str_id_end;
  str_id_end_local = str_id_begin;
  local_2c = ImGuiWindow::GetIDNoKeepAlive(pIStack_28,str_id_begin,str_id_end);
  ImVector<unsigned_int>::push_back(&pIStack_28->IDStack,&local_2c);
  return;
}

Assistant:

void ImGui::PushID(const char* str_id_begin, const char* str_id_end)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiID id = window->GetIDNoKeepAlive(str_id_begin, str_id_end);
    window->IDStack.push_back(id);
}